

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmQtAutoGenInitializer.cxx
# Opt level: O1

bool (anonymous_namespace)::InfoWriter::
     MakeArray<std::vector<cmQtAutoGenInitializer::MUFile_const*,std::allocator<cmQtAutoGenInitializer::MUFile_const*>>>
               (Value *jval,
               vector<const_cmQtAutoGenInitializer::MUFile_*,_std::allocator<const_cmQtAutoGenInitializer::MUFile_*>_>
               *container)

{
  pointer ppMVar1;
  pointer ppMVar2;
  ulong uVar3;
  Value local_40;
  
  Json::Value::Value(&local_40,arrayValue);
  Json::Value::operator=(jval,&local_40);
  Json::Value::~Value(&local_40);
  ppMVar1 = (container->
            super__Vector_base<const_cmQtAutoGenInitializer::MUFile_*,_std::allocator<const_cmQtAutoGenInitializer::MUFile_*>_>
            )._M_impl.super__Vector_impl_data._M_start;
  ppMVar2 = (container->
            super__Vector_base<const_cmQtAutoGenInitializer::MUFile_*,_std::allocator<const_cmQtAutoGenInitializer::MUFile_*>_>
            )._M_impl.super__Vector_impl_data._M_finish;
  uVar3 = (long)ppMVar2 - (long)ppMVar1;
  if (uVar3 != 0) {
    Json::Value::resize(jval,(ArrayIndex)(uVar3 >> 3));
  }
  return ppMVar2 != ppMVar1;
}

Assistant:

bool InfoWriter::MakeArray(Json::Value& jval, CONT const& container)
{
  jval = Json::arrayValue;
  std::size_t const listSize = cm::size(container);
  if (listSize == 0) {
    return false;
  }
  jval.resize(static_cast<unsigned int>(listSize));
  return true;
}